

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int P_FindUniqueTID(int start_tid,int limit)

{
  bool bVar1;
  int iVar2;
  uint local_20;
  int local_1c;
  int local_18;
  int i;
  int tid;
  int limit_local;
  int start_tid_local;
  
  if (start_tid == 0) {
    i = limit;
    if (limit == 0) {
      i = 0x7fffffff;
    }
    for (local_1c = 0; local_1c < i; local_1c = local_1c + 5) {
      local_20 = FRandom::GenRand32(&pr_uniquetid);
      local_20 = local_20 & 0x7fffffff;
      if (local_20 == 0) {
        local_20 = 1;
      }
      iVar2 = P_FindUniqueTID(local_20,5);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
  }
  else {
    local_18 = start_tid;
    if (-0x80000000 - limit < start_tid) {
      i = 0x7fffffff;
    }
    else {
      i = start_tid + -1 + limit;
    }
    for (; local_18 <= i; local_18 = local_18 + 1) {
      if ((local_18 != 0) && (bVar1 = P_IsTIDUsed(local_18), !bVar1)) {
        return local_18;
      }
    }
  }
  return 0;
}

Assistant:

int P_FindUniqueTID(int start_tid, int limit)
{
	int tid;

	if (start_tid != 0)
	{ // Do a linear search.
		if (start_tid > INT_MAX-limit+1)
		{ // If 'limit+start_tid-1' overflows, clamp 'limit' to INT_MAX
			limit = INT_MAX;
		}
		else
		{
			limit += start_tid-1;
		}
		for (tid = start_tid; tid <= limit; ++tid)
		{
			if (tid != 0 && !P_IsTIDUsed(tid))
			{
				return tid;
			}
		}
		// Nothing free found.
		return 0;
	}
	// Do a random search. To try and be a bit more performant, this
	// actually does several linear searches. In the case of *very*
	// dense TID usage, this could potentially perform worse than doing
	// a complete linear scan starting at 1. However, you would need
	// to use an absolutely ridiculous number of actors before this
	// becomes a real concern.
	if (limit == 0)
	{
		limit = INT_MAX;
	}
	for (int i = 0; i < limit; i += 5)
	{
		// Use a positive starting TID.
		tid = pr_uniquetid.GenRand32() & INT_MAX;
		tid = P_FindUniqueTID(tid == 0 ? 1 : tid, 5);
		if (tid != 0)
		{
			return tid;
		}
	}
	// Nothing free found.
	return 0;
}